

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstorageinfo.cpp
# Opt level: O3

void __thiscall QStorageInfo::setPath(QStorageInfo *this,QString *path)

{
  long lVar1;
  bool bVar2;
  QStorageInfoPrivate *pQVar3;
  QStringView rhs;
  QStringView lhs;
  
  pQVar3 = (this->d).d.ptr;
  lVar1 = (pQVar3->rootPath).d.size;
  if (lVar1 == (path->d).size) {
    rhs.m_data = (path->d).ptr;
    rhs.m_size = lVar1;
    lhs.m_data = (pQVar3->rootPath).d.ptr;
    lhs.m_size = lVar1;
    bVar2 = QtPrivate::equalStrings(lhs,rhs);
    if (bVar2) {
      return;
    }
  }
  if ((__atomic_base<int>)
      *(__int_type_conflict *)
       &(pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1) {
    QExplicitlySharedDataPointer<QStorageInfoPrivate>::detach_helper(&this->d);
    pQVar3 = (this->d).d.ptr;
  }
  QString::operator=(&pQVar3->rootPath,path);
  QStorageInfoPrivate::doStat((this->d).d.ptr);
  return;
}

Assistant:

void QStorageInfo::setPath(const QString &path)
{
    if (d->rootPath == path)
        return;
    d.detach();
    d->rootPath = path;
    d->doStat();
}